

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QFixed>::resize_internal(QList<QFixed> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QFixed> *this_00;
  __off_t __length;
  QArrayDataPointer<QFixed> *in_RSI;
  QArrayDataPointer<QFixed> *in_RDI;
  QArrayDataPointer<QFixed> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QFixed> *this_01;
  QArrayDataPointer<QFixed> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QFixed> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QFixed> *__file;
  
  QArrayDataPointer<QFixed>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QFixed>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 = (QArrayDataPointer<QFixed> *)capacity((QList<QFixed> *)0x788311);
    qVar2 = QArrayDataPointer<QFixed>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QFixed> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QFixed> *)QArrayDataPointer<QFixed>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QFixed>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QFixed>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QFixed **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}